

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::GatherEnumsTest::Run(GatherEnumsTest *this)

{
  undefined8 in_RAX;
  long lVar1;
  CallLogWrapper *this_00;
  GLint res;
  
  res = (GLint)((ulong)in_RAX >> 0x20);
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8e5e,&res);
  if (res < -7) {
    glu::CallLogWrapper::glGetIntegerv(this_00,0x8e5f,&res);
    lVar1 = -(ulong)(res < 7);
  }
  else {
    lVar1 = -1;
  }
  return lVar1;
}

Assistant:

virtual long Run()
	{
		GLint res;
		glGetIntegerv(GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET, &res);
		if (res > -8)
		{
			return ERROR;
		}
		glGetIntegerv(GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET, &res);
		if (res < 7)
		{
			return ERROR;
		}
		return NO_ERROR;
	}